

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fComputeShaderBuiltinVarTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::LocalInvocationIndexCase::LocalInvocationIndexCase
          (LocalInvocationIndexCase *this,Context *context)

{
  Vector<unsigned_int,_3> local_148;
  Vector<unsigned_int,_3> local_13c;
  SubCase local_130;
  Vector<unsigned_int,_3> local_118;
  Vector<unsigned_int,_3> local_10c;
  SubCase local_100;
  Vector<unsigned_int,_3> local_e8;
  Vector<unsigned_int,_3> local_dc;
  SubCase local_d0;
  Vector<unsigned_int,_3> local_b8;
  Vector<unsigned_int,_3> local_ac;
  SubCase local_a0;
  Vector<unsigned_int,_3> local_88;
  Vector<unsigned_int,_3> local_7c;
  SubCase local_70;
  Vector<unsigned_int,_3> local_58 [2];
  Vector<unsigned_int,_3> local_3c;
  SubCase local_30;
  Context *local_18;
  Context *context_local;
  LocalInvocationIndexCase *this_local;
  
  local_18 = context;
  context_local = (Context *)this;
  ComputeBuiltinVarCase::ComputeBuiltinVarCase
            (&this->super_ComputeBuiltinVarCase,context,"local_invocation_index",
             "gl_LocalInvocationIndex",TYPE_UINT);
  (this->super_ComputeBuiltinVarCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__LocalInvocationIndexCase_032c0ea8;
  tcu::Vector<unsigned_int,_3>::Vector(&local_3c,1,1,1);
  tcu::Vector<unsigned_int,_3>::Vector(local_58,1,1,1);
  ComputeBuiltinVarCase::SubCase::SubCase(&local_30,&local_3c,local_58);
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::push_back(&(this->super_ComputeBuiltinVarCase).m_subCases,&local_30);
  tcu::Vector<unsigned_int,_3>::Vector(&local_7c,1,1,1);
  tcu::Vector<unsigned_int,_3>::Vector(&local_88,1,0x27,1);
  ComputeBuiltinVarCase::SubCase::SubCase(&local_70,&local_7c,&local_88);
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::push_back(&(this->super_ComputeBuiltinVarCase).m_subCases,&local_70);
  tcu::Vector<unsigned_int,_3>::Vector(&local_ac,1,1,1);
  tcu::Vector<unsigned_int,_3>::Vector(&local_b8,4,7,0xb);
  ComputeBuiltinVarCase::SubCase::SubCase(&local_a0,&local_ac,&local_b8);
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::push_back(&(this->super_ComputeBuiltinVarCase).m_subCases,&local_a0);
  tcu::Vector<unsigned_int,_3>::Vector(&local_dc,2,3,4);
  tcu::Vector<unsigned_int,_3>::Vector(&local_e8,4,7,0xb);
  ComputeBuiltinVarCase::SubCase::SubCase(&local_d0,&local_dc,&local_e8);
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::push_back(&(this->super_ComputeBuiltinVarCase).m_subCases,&local_d0);
  tcu::Vector<unsigned_int,_3>::Vector(&local_10c,10,3,4);
  tcu::Vector<unsigned_int,_3>::Vector(&local_118,1,1,1);
  ComputeBuiltinVarCase::SubCase::SubCase(&local_100,&local_10c,&local_118);
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::push_back(&(this->super_ComputeBuiltinVarCase).m_subCases,&local_100);
  tcu::Vector<unsigned_int,_3>::Vector(&local_13c,10,3,4);
  tcu::Vector<unsigned_int,_3>::Vector(&local_148,3,1,2);
  ComputeBuiltinVarCase::SubCase::SubCase(&local_130,&local_13c,&local_148);
  std::
  vector<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::push_back(&(this->super_ComputeBuiltinVarCase).m_subCases,&local_130);
  return;
}

Assistant:

LocalInvocationIndexCase (Context& context)
		: ComputeBuiltinVarCase(context, "local_invocation_index", "gl_LocalInvocationIndex", TYPE_UINT)
	{
		m_subCases.push_back(SubCase(UVec3(1,1,1), UVec3(1,1,1)));
		m_subCases.push_back(SubCase(UVec3(1,1,1), UVec3(1,39,1)));
		m_subCases.push_back(SubCase(UVec3(1,1,1), UVec3(4,7,11)));
		m_subCases.push_back(SubCase(UVec3(2,3,4), UVec3(4,7,11)));
		m_subCases.push_back(SubCase(UVec3(10,3,4), UVec3(1,1,1)));
		m_subCases.push_back(SubCase(UVec3(10,3,4), UVec3(3,1,2)));
	}